

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf128.c
# Opt level: O3

void cf_gf128_mul(uint32_t *x,uint32_t *y,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  cf_gf128 V;
  ulong local_58;
  ulong local_48;
  undefined8 uStack_40;
  
  local_48 = *(ulong *)y;
  uStack_40 = *(undefined8 *)(y + 2);
  local_58 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar5 = 0;
  do {
    uVar1 = (uint)((x[uVar4 >> 5] >> (~uVar4 & 0x1f) & 1) != 0);
    uVar2 = 0;
    if ((x[uVar4 >> 5] >> (~uVar4 & 0x1f) & 1) != 0) {
      uVar2 = (uint)uStack_40;
    }
    uVar5 = uVar5 ^ uVar2;
    local_58 = local_58 ^
               CONCAT44((int)(uVar1 * -0x80000000) >> 0x1f,(int)(uVar1 * -0x80000000) >> 0x1f) &
               local_48;
    uVar3 = uVar3 ^ -uVar1 & uStack_40._4_4_;
    cf_gf128_double_le((uint32_t *)&local_48,(uint32_t *)&local_48);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x80);
  *(ulong *)out = local_58;
  out[2] = uVar5;
  out[3] = uVar3;
  return;
}

Assistant:

void cf_gf128_mul(const cf_gf128 x, const cf_gf128 y, cf_gf128 out)
{
#if CF_TIME_SIDE_CHANNEL_PROTECTION
  cf_gf128 zero = { 0 };
#endif

  /* Z_0 = 0^128
   * V_0 = Y */
  cf_gf128 Z, V;
  memset(Z, 0, sizeof Z);
  memcpy(V, y, sizeof V);

  int i;
  for (i = 0; i < 128; i++)
  {
    uint32_t word = x[i >> 5];
    uint8_t bit = (word >> (31 - (i & 31))) & 1;

#if CF_TIME_SIDE_CHANNEL_PROTECTION
    select_xor128(Z, zero, V, bit);
#else
    if (bit)
      xor_words(Z, V, 4);
#endif

    cf_gf128_double_le(V, V);
  }

  memcpy(out, Z, sizeof Z);
}